

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_bbdpre.c
# Opt level: O0

int ARKBBDPrecFree(ARKodeMem ark_mem)

{
  ARKodeMem ark_mem_00;
  long in_RDI;
  ARKBBDPrecData pdata;
  void *ark_step_lmem;
  ARKLsMem arkls_mem;
  N_Vector *v;
  
  if (((in_RDI != 0) &&
      (ark_mem_00 = (ARKodeMem)(**(code **)(in_RDI + 0x128))(in_RDI), ark_mem_00 != (ARKodeMem)0x0))
     && (ark_mem_00->step_setorder != (ARKTimestepSetOrder)0x0)) {
    v = (N_Vector *)ark_mem_00->step_setorder;
    SUNLinSolFree(v[9]);
    arkFreeVec(ark_mem_00,v);
    arkFreeVec(ark_mem_00,v);
    arkFreeVec(ark_mem_00,v);
    N_VDestroy(v[0xd]);
    N_VDestroy(v[0xe]);
    SUNMatDestroy(v[8]);
    SUNMatDestroy(v[7]);
    free(v);
  }
  return 0;
}

Assistant:

static int ARKBBDPrecFree(ARKodeMem ark_mem)
{
  ARKLsMem arkls_mem;
  void* ark_step_lmem;
  ARKBBDPrecData pdata;

  /* Return immediately if ARKodeMem, ARKLsMem or ARKBandPrecData are NULL */
  if (ark_mem == NULL) { return (0); }
  ark_step_lmem = ark_mem->step_getlinmem((void*)ark_mem);
  if (ark_step_lmem == NULL) { return (0); }
  arkls_mem = (ARKLsMem)ark_step_lmem;
  if (arkls_mem->P_data == NULL) { return (0); }
  pdata = (ARKBBDPrecData)arkls_mem->P_data;

  SUNLinSolFree(pdata->LS);
  arkFreeVec(ark_mem, &(pdata->tmp1));
  arkFreeVec(ark_mem, &(pdata->tmp2));
  arkFreeVec(ark_mem, &(pdata->tmp3));
  N_VDestroy(pdata->zlocal);
  N_VDestroy(pdata->rlocal);
  SUNMatDestroy(pdata->savedP);
  SUNMatDestroy(pdata->savedJ);

  free(pdata);
  pdata = NULL;

  return (0);
}